

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O2

void aes_ecb(uchar *out,uchar *in,size_t nblocks,uint64_t *rkeys,uint nrounds)

{
  size_t __n;
  size_t num;
  uint32_t blocks [16];
  uchar t [64];
  
  __n = nblocks << 4;
  num = nblocks * 4;
  for (; 3 < nblocks; nblocks = nblocks - 4) {
    br_range_dec32le(blocks,0x10,in);
    aes_ecb4x(out,blocks,rkeys,nrounds);
    in = in + 0x40;
    out = out + 0x40;
    __n = __n - 0x40;
    num = num - 0x10;
  }
  if (nblocks != 0) {
    br_range_dec32le(blocks,num,in);
    aes_ecb4x(t,blocks,rkeys,nrounds);
    memcpy(out,t,__n);
  }
  return;
}

Assistant:

static void aes_ecb(unsigned char *out, const unsigned char *in, size_t nblocks, const uint64_t *rkeys, unsigned int nrounds) {
    uint32_t blocks[16];
    unsigned char t[64];

    while (nblocks >= 4) {
        br_range_dec32le(blocks, 16, in);
        aes_ecb4x(out, blocks, rkeys, nrounds);
        nblocks -= 4;
        in += 64;
        out += 64;
    }

    if (nblocks) {
        br_range_dec32le(blocks, nblocks * 4, in);
        aes_ecb4x(t, blocks, rkeys, nrounds);
        memcpy(out, t, nblocks * 16);
    }
}